

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O1

void __thiscall MainWindow::onFileOpen(MainWindow *this)

{
  bool bVar1;
  QByteArrayView QVar2;
  QString path;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QString local_50;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  QArrayData *local_20 [3];
  
  bVar1 = maybeSave(this);
  if (bVar1) {
    QMetaObject::tr((char *)local_20,(char *)&staticMetaObject,0x1b5d60);
    QVar2.m_data = (storage_type *)0x0;
    QVar2.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar2);
    local_68 = local_38;
    uStack_60 = uStack_30;
    local_58 = local_28;
    QMetaObject::tr((char *)&local_38,(char *)&staticMetaObject,0x1b5fc2);
    QFileDialog::getOpenFileName(&local_50,this,local_20,&local_68,&local_38,0,0);
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,2,8);
      }
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,8);
      }
    }
    if (local_20[0] != (QArrayData *)0x0) {
      LOCK();
      (local_20[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_20[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_20[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_20[0],2,8);
      }
    }
    if (local_50.d.size != 0) {
      openFile(this,&local_50);
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
      }
    }
  }
  return;
}

Assistant:

void MainWindow::onFileOpen() {
    if (!maybeSave()) {
        return;
    }
    
    auto path = QFileDialog::getOpenFileName(
        this,
        tr("Open module"),
        "",
        tr(TU::MODULE_FILE_FILTER)
    );

    if (path.isEmpty()) {
        return;
    }

    openFile(path);

}